

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeOverwriteContent(MemPage *pPage,u8 *pDest,BtreePayload *pX,int iOffset,int iAmt)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int rc_2;
  int rc_1;
  int rc;
  int i;
  int nData;
  int iAmt_local;
  int iOffset_local;
  BtreePayload *pX_local;
  u8 *pDest_local;
  MemPage *pPage_local;
  
  iVar1 = pX->nData - iOffset;
  if (iVar1 < 1) {
    rc_1 = 0;
    while( true ) {
      bVar3 = false;
      if (rc_1 < iAmt) {
        bVar3 = pDest[rc_1] == '\0';
      }
      if (!bVar3) break;
      rc_1 = rc_1 + 1;
    }
    if (rc_1 < iAmt) {
      iVar1 = sqlite3PagerWrite(pPage->pDbPage);
      if (iVar1 != 0) {
        return iVar1;
      }
      memset(pDest + rc_1,0,(long)(iAmt - rc_1));
    }
  }
  else {
    i = iAmt;
    if ((iVar1 < iAmt) &&
       (iVar2 = btreeOverwriteContent(pPage,pDest + iVar1,pX,iOffset + iVar1,iAmt - iVar1),
       i = iVar1, iVar2 != 0)) {
      return iVar2;
    }
    iVar1 = memcmp(pDest,(void *)((long)pX->pData + (long)iOffset),(long)i);
    if (iVar1 != 0) {
      iVar1 = sqlite3PagerWrite(pPage->pDbPage);
      if (iVar1 != 0) {
        return iVar1;
      }
      memmove(pDest,(void *)((long)pX->pData + (long)iOffset),(long)i);
    }
  }
  return 0;
}

Assistant:

static int btreeOverwriteContent(
  MemPage *pPage,           /* MemPage on which writing will occur */
  u8 *pDest,                /* Pointer to the place to start writing */
  const BtreePayload *pX,   /* Source of data to write */
  int iOffset,              /* Offset of first byte to write */
  int iAmt                  /* Number of bytes to be written */
){
  int nData = pX->nData - iOffset;
  if( nData<=0 ){
    /* Overwritting with zeros */
    int i;
    for(i=0; i<iAmt && pDest[i]==0; i++){}
    if( i<iAmt ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      memset(pDest + i, 0, iAmt - i);
    }
  }else{
    if( nData<iAmt ){
      /* Mixed read data and zeros at the end.  Make a recursive call
      ** to write the zeros then fall through to write the real data */
      int rc = btreeOverwriteContent(pPage, pDest+nData, pX, iOffset+nData,
                                 iAmt-nData);
      if( rc ) return rc;
      iAmt = nData;
    }
    if( memcmp(pDest, ((u8*)pX->pData) + iOffset, iAmt)!=0 ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      /* In a corrupt database, it is possible for the source and destination
      ** buffers to overlap.  This is harmless since the database is already
      ** corrupt but it does cause valgrind and ASAN warnings.  So use
      ** memmove(). */
      memmove(pDest, ((u8*)pX->pData) + iOffset, iAmt);
    }
  }
  return SQLITE_OK;
}